

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImDrawListSplitter *pIVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  double dVar4;
  ImGuiWindow *pIVar5;
  ImGuiTableTempData *pIVar6;
  ImGuiWindow *pIVar7;
  float *__src;
  ImGuiTableColumn *pIVar8;
  float fVar9;
  uint uVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ImU32 IVar16;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiTableTempData *__dest;
  float *__dest_00;
  ImGuiTableColumn *pIVar17;
  char *pcVar18;
  ImGuiTableColumn *pIVar19;
  char *__dest_01;
  long lVar20;
  ImRect *pIVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  size_t size;
  int iVar25;
  ImVec2 *pIVar26;
  ImGuiTableColumnFlags *pIVar27;
  ImVec2 *pIVar28;
  ImGuiID id_00;
  long lVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  byte bVar33;
  float fVar34;
  undefined4 in_XMM0_Db;
  ImVec2 IVar35;
  ImVec2 IVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  ImGuiContext *g;
  ImRect outer_rect;
  void *local_108;
  ImRect local_f8;
  float *local_e8;
  ImGuiTableTempData *local_e0;
  undefined8 local_d8;
  char *local_c8;
  ulong local_c0;
  ulong local_b8;
  ImVec2 *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImDrawListSplitter local_98;
  undefined3 uStack_80;
  undefined5 uStack_7d;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar11 = GImGui;
  bVar33 = 0;
  local_d8 = (ImGuiWindow *)CONCAT44(in_XMM0_Db,inner_width);
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  uVar22 = (ulong)(uint)columns_count;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x13e,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x140,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar35 = GetContentRegionAvail();
  fVar37 = IVar35.x;
  fVar39 = IVar35.y;
  if (fVar37 <= 1.0) {
    fVar37 = 1.0;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar35 = CalcItemSize(*outer_size,fVar37,0.0);
    local_f8.Min = (pIVar5->DC).CursorPos;
    local_f8.Max.y = IVar35.y + (pIVar5->DC).CursorPos.y;
    local_f8.Max.x = (pIVar5->DC).CursorPos.x + IVar35.x;
  }
  else {
    if (fVar39 <= 1.0) {
      fVar39 = 1.0;
    }
    IVar35 = CalcItemSize(*outer_size,fVar37,fVar39);
    local_f8.Min = (pIVar5->DC).CursorPos;
    local_f8.Max.y = IVar35.y + (pIVar5->DC).CursorPos.y;
    local_f8.Max.x = (pIVar5->DC).CursorPos.x + IVar35.x;
    bVar12 = IsClippedEx(&local_f8,0);
    if (bVar12) {
      ItemSize(&local_f8,-1.0);
      return false;
    }
  }
  local_c8 = name;
  local_b8 = (ulong)id;
  local_b0 = outer_size;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar11->Tables,id);
  local_c0 = 0;
  if (p_00->LastFrameActive == pIVar11->FrameCount) {
    local_c0 = (ulong)((int)p_00->InstanceCurrent + 1);
  }
  local_e8 = (float *)CONCAT44(local_e8._4_4_,p_00->Flags);
  if ((0 < (int)local_c0) && (p_00->ColumnsCount != columns_count)) {
    __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x153,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  uVar13 = ImPool<ImGuiTable>::GetIndex(&pIVar11->Tables,p_00);
  iVar24 = pIVar11->TablesTempDataStacked;
  iVar25 = (int)((long)iVar24 + 1);
  pIVar11->TablesTempDataStacked = iVar25;
  if ((pIVar11->TablesTempData).Size <= iVar24) {
    uStack_a0 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6d = 0;
    local_98._Channels.Data = (ImDrawChannel *)0x0;
    uStack_80 = 0;
    uStack_7d = 0;
    local_98._Current = 0;
    local_98._Count = 0;
    local_98._Channels.Size = 0;
    local_98._Channels.Capacity = 0;
    local_a8.x = 0.0;
    local_a8.y = -1.0;
    iVar31 = (pIVar11->TablesTempData).Capacity;
    if (iVar31 <= iVar24) {
      if (iVar31 == 0) {
        iVar30 = 8;
      }
      else {
        iVar30 = iVar31 / 2 + iVar31;
      }
      if (iVar30 <= iVar25) {
        iVar30 = iVar25;
      }
      if (iVar31 < iVar30) {
        __dest = (ImGuiTableTempData *)MemAlloc((long)iVar30 * 0x70);
        pIVar6 = (pIVar11->TablesTempData).Data;
        if (pIVar6 != (ImGuiTableTempData *)0x0) {
          local_e0 = __dest;
          memcpy(__dest,pIVar6,(long)(pIVar11->TablesTempData).Size * 0x70);
          MemFree((pIVar11->TablesTempData).Data);
          __dest = local_e0;
        }
        (pIVar11->TablesTempData).Data = __dest;
        (pIVar11->TablesTempData).Capacity = iVar30;
      }
    }
    iVar31 = (pIVar11->TablesTempData).Size;
    if (iVar31 <= iVar24) {
      lVar23 = ((long)iVar24 + 1) - (long)iVar31;
      lVar29 = (long)iVar31 * 0x70;
      do {
        pIVar26 = &local_a8;
        pIVar28 = (ImVec2 *)((long)&((pIVar11->TablesTempData).Data)->TableIndex + lVar29);
        for (lVar20 = 0xe; lVar20 != 0; lVar20 = lVar20 + -1) {
          *pIVar28 = *pIVar26;
          pIVar26 = pIVar26 + (ulong)bVar33 * -2 + 1;
          pIVar28 = pIVar28 + (ulong)bVar33 * -2 + 1;
        }
        lVar29 = lVar29 + 0x70;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
    }
    (pIVar11->TablesTempData).Size = iVar25;
    ImDrawListSplitter::ClearFreeMemory(&local_98);
    if (local_98._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_98._Channels.Data);
    }
  }
  lVar23 = (long)pIVar11->TablesTempDataStacked;
  if ((lVar23 < 1) || ((pIVar11->TablesTempData).Size < pIVar11->TablesTempDataStacked)) {
    pcVar18 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
  }
  else {
    pIVar6 = (pIVar11->TablesTempData).Data;
    p_00->TempData = pIVar6 + lVar23 + -1;
    pIVar6[lVar23 + -1].TableIndex = uVar13;
    pIVar1 = &pIVar6[lVar23 + -1].DrawSplitter;
    p_00->DrawSplitter = pIVar1;
    pIVar1->_Current = 0;
    pIVar1->_Count = 1;
    bVar12 = (flags & 0xe000U) == 0;
    p_00->IsDefaultSizingPolicy = bVar12;
    uVar14 = flags;
    if (bVar12) {
      uVar14 = 0x2000;
      if ((((uint)flags >> 0x18 & 1) == 0) && (uVar14 = 0x2000, (pIVar5->Flags & 0x40) == 0)) {
        uVar14 = 0x8000;
      }
      uVar14 = uVar14 | flags;
    }
    uVar15 = uVar14 | 0x40000;
    if ((uVar14 & 0xe000) != 0x4000) {
      uVar15 = uVar14;
    }
    uVar14 = uVar15 & 0xfffcffff;
    if ((uVar15 & 0x3000000) == 0) {
      uVar14 = uVar15;
    }
    uVar10 = uVar14 & 0xfffff7ff;
    if ((uVar14 >> 0xc & 1) == 0) {
      uVar10 = uVar14;
    }
    uVar14 = (uVar15 & 1) << 9 | uVar10;
    uVar15 = uVar14 | 0x10;
    if ((uVar10 & 0xf) == 0) {
      uVar14 = uVar15;
    }
    id_00 = (int)local_c0 + (ImGuiID)local_b8;
    if (((uint)pIVar5->RootWindow->Flags >> 8 & 1) != 0) {
      uVar14 = uVar15;
    }
    p_00->ID = (ImGuiID)local_b8;
    p_00->Flags = uVar14;
    p_00->InstanceCurrent = (ImS16)local_c0;
    p_00->LastFrameActive = pIVar11->FrameCount;
    p_00->InnerWindow = pIVar5;
    p_00->OuterWindow = pIVar5;
    p_00->ColumnsCount = columns_count;
    p_00->IsLayoutLocked = false;
    p_00->InnerWidth = (float)local_d8;
    pIVar6[lVar23 + -1].UserOuterSize = *local_b0;
    if ((flags & 0x3000000U) == 0) {
      (p_00->InnerRect).Min = local_f8.Min;
      (p_00->InnerRect).Max = local_f8.Max;
      (p_00->OuterRect).Min = local_f8.Min;
      (p_00->OuterRect).Max = local_f8.Max;
      (p_00->WorkRect).Min = local_f8.Min;
      (p_00->WorkRect).Max = local_f8.Max;
    }
    else {
      fVar37 = (float)local_d8;
      if ((uVar14 & 0x1000000) == 0) {
        fVar37 = 3.4028235e+38;
      }
      fVar37 = (float)(~-(uint)(0.0 < (float)local_d8) & 0x7f7fffff |
                      (uint)fVar37 & -(uint)(0.0 < (float)local_d8));
      if (fVar37 != 3.4028235e+38 || (uVar14 & 0x3000000) == 0x1000000) {
        if ((uVar14 & 0x3000000) == 0x1000000) {
          local_a8.y = 1.1754944e-38;
        }
        else {
          local_a8.y = 0.0;
        }
        local_a8.x = (float)(-(uint)(fVar37 != 3.4028235e+38) & (uint)fVar37);
        SetNextWindowContentSize(&local_a8);
      }
      if (((ulong)local_e8 & 0x3000000) == 0) {
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        SetNextWindowScroll(&local_a8);
      }
      local_a8.x = local_f8.Max.x - local_f8.Min.x;
      local_a8.y = local_f8.Max.y - local_f8.Min.y;
      BeginChildEx(local_c8,id_00,&local_a8,false,(uVar14 & 0x1000000) >> 0xd);
      pIVar7 = pIVar11->CurrentWindow;
      p_00->InnerWindow = pIVar7;
      IVar35 = (pIVar7->WorkRect).Max;
      (p_00->WorkRect).Min = (pIVar7->WorkRect).Min;
      (p_00->WorkRect).Max = IVar35;
      fVar37 = (pIVar7->Pos).x;
      fVar39 = (pIVar7->Pos).y;
      fVar34 = (pIVar7->Size).x;
      fVar38 = (pIVar7->Size).y;
      fVar9 = (pIVar7->Pos).y;
      (p_00->OuterRect).Min.x = (pIVar7->Pos).x;
      (p_00->OuterRect).Min.y = fVar9;
      (p_00->OuterRect).Max.x = fVar37 + fVar34;
      (p_00->OuterRect).Max.y = fVar39 + fVar38;
      IVar35 = (pIVar7->InnerRect).Max;
      (p_00->InnerRect).Min = (pIVar7->InnerRect).Min;
      (p_00->InnerRect).Max = IVar35;
      if (((((pIVar7->WindowPadding).x != 0.0) ||
           (fVar37 = (pIVar7->WindowPadding).y, fVar37 != 0.0)) || (NAN(fVar37))) ||
         ((pIVar7->WindowBorderSize != 0.0 || (NAN(pIVar7->WindowBorderSize))))) {
        __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                      ,0x18b,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
    }
    PushOverrideID(id_00);
    pIVar7 = p_00->InnerWindow;
    p_00->HostIndentX = (pIVar7->DC).Indent.x;
    IVar35 = (pIVar7->ClipRect).Max;
    (p_00->HostClipRect).Min = (pIVar7->ClipRect).Min;
    (p_00->HostClipRect).Max = IVar35;
    p_00->HostSkipItems = pIVar7->SkipItems;
    IVar35 = (pIVar7->WorkRect).Max;
    pIVar6[lVar23 + -1].HostBackupWorkRect.Min = (pIVar7->WorkRect).Min;
    pIVar6[lVar23 + -1].HostBackupWorkRect.Max = IVar35;
    IVar35 = (pIVar7->ParentWorkRect).Max;
    pIVar6[lVar23 + -1].HostBackupParentWorkRect.Min = (pIVar7->ParentWorkRect).Min;
    pIVar6[lVar23 + -1].HostBackupParentWorkRect.Max = IVar35;
    pIVar6[lVar23 + -1].HostBackupColumnsOffset.x = (pIVar5->DC).ColumnsOffset.x;
    pIVar6[lVar23 + -1].HostBackupPrevLineSize = (pIVar7->DC).PrevLineSize;
    pIVar6[lVar23 + -1].HostBackupCurrLineSize = (pIVar7->DC).CurrLineSize;
    pIVar6[lVar23 + -1].HostBackupCursorMaxPos = (pIVar7->DC).CursorMaxPos;
    pIVar6[lVar23 + -1].HostBackupItemWidth = (pIVar5->DC).ItemWidth;
    pIVar6[lVar23 + -1].HostBackupItemWidthStackSize = (pIVar5->DC).ItemWidthStack.Size;
    fVar37 = 0.0;
    fVar39 = 0.0;
    if ((uVar14 >> 9 & 1) != 0) {
      fVar39 = 1.0;
    }
    (pIVar7->DC).CurrLineSize.x = 0.0;
    (pIVar7->DC).CurrLineSize.y = 0.0;
    (pIVar7->DC).PrevLineSize.x = 0.0;
    (pIVar7->DC).PrevLineSize.y = 0.0;
    if ((uVar14 & 0x800200) == 0) {
      fVar37 = (pIVar11->Style).CellPadding.x;
    }
    fVar38 = 0.0;
    fVar34 = 0.0;
    if ((uVar14 & 0x800200) == 0x200) {
      fVar34 = (pIVar11->Style).CellPadding.x;
    }
    p_00->CellSpacingX1 = fVar39 + fVar37;
    p_00->CellSpacingX2 = fVar37;
    p_00->CellPaddingX = fVar34;
    p_00->CellPaddingY = (pIVar11->Style).CellPadding.y;
    fVar37 = 0.0;
    if ((uVar14 >> 10 & 1) != 0) {
      fVar37 = 1.0;
    }
    if ((uVar14 >> 0x16 & 1) == 0 && (uVar14 & 0x200400) != 0) {
      fVar38 = (pIVar11->Style).CellPadding.x;
    }
    p_00->OuterPaddingX = (fVar37 + fVar38) - fVar34;
    p_00->CurrentRow = -1;
    p_00->CurrentColumn = -1;
    p_00->RowBgColorCounter = 0;
    *(uint *)&p_00->field_0x98 = (uint)*(ushort *)&p_00->field_0x98;
    pIVar21 = &pIVar7->ClipRect;
    if (pIVar7 == pIVar5) {
      pIVar21 = &p_00->WorkRect;
    }
    IVar35 = pIVar21->Max;
    (p_00->InnerClipRect).Min = pIVar21->Min;
    (p_00->InnerClipRect).Max = IVar35;
    fVar37 = (p_00->InnerClipRect).Min.x;
    fVar39 = (p_00->InnerClipRect).Min.y;
    fVar34 = (p_00->WorkRect).Min.x;
    fVar38 = (p_00->WorkRect).Min.y;
    uVar15 = -(uint)(fVar34 <= fVar37);
    IVar35.x = (float)(~uVar15 & (uint)fVar34 | (uint)fVar37 & uVar15);
    uVar15 = -(uint)(fVar38 <= fVar39);
    IVar35.y = (float)(~uVar15 & (uint)fVar38 | (uint)fVar39 & uVar15);
    (p_00->InnerClipRect).Min = IVar35;
    fVar39 = (p_00->InnerClipRect).Max.x;
    fVar37 = (p_00->WorkRect).Max.x;
    if (fVar37 <= fVar39) {
      fVar39 = fVar37;
    }
    fVar37 = (p_00->InnerClipRect).Max.y;
    fVar34 = (p_00->WorkRect).Max.y;
    if (fVar34 <= fVar37) {
      fVar37 = fVar34;
    }
    IVar36.y = fVar37;
    IVar36.x = fVar39;
    (p_00->InnerClipRect).Max = IVar36;
    ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
    if ((uVar14 >> 0x11 & 1) == 0) {
      fVar37 = (pIVar7->ClipRect).Max.y;
    }
    else {
      fVar37 = (p_00->InnerClipRect).Max.y;
      fVar39 = (pIVar7->WorkRect).Max.y;
      if (fVar39 <= fVar37) {
        fVar37 = fVar39;
      }
    }
    (p_00->InnerClipRect).Max.y = fVar37;
    fVar37 = (p_00->WorkRect).Min.y;
    p_00->RowPosY2 = fVar37;
    p_00->RowPosY1 = fVar37;
    p_00->RowTextBaseline = 0.0;
    p_00->FreezeRowsRequest = '\0';
    p_00->FreezeRowsCount = '\0';
    p_00->FreezeColumnsRequest = '\0';
    p_00->FreezeColumnsCount = '\0';
    p_00->IsUnfrozenRows = true;
    p_00->DeclColumnsCount = '\0';
    IVar16 = GetColorU32(0x2d,1.0);
    p_00->BorderColorStrong = IVar16;
    IVar16 = GetColorU32(0x2e,1.0);
    p_00->BorderColorLight = IVar16;
    pIVar11->CurrentTable = p_00;
    (pIVar5->DC).CurrentTableIdx = uVar13;
    if (pIVar7 != pIVar5) {
      (pIVar7->DC).CurrentTableIdx = uVar13;
    }
    if ((((ulong)local_e8 & 2) != 0) && ((uVar14 & 2) == 0)) {
      p_00->IsResetDisplayOrderRequest = true;
    }
    local_d8 = pIVar7;
    if ((pIVar11->TablesLastTimeActive).Size <= (int)uVar13) {
      iVar25 = uVar13 + 1;
      iVar24 = (pIVar11->TablesLastTimeActive).Capacity;
      if (iVar24 <= (int)uVar13) {
        if (iVar24 == 0) {
          iVar31 = 8;
        }
        else {
          iVar31 = iVar24 / 2 + iVar24;
        }
        if (iVar31 <= iVar25) {
          iVar31 = iVar25;
        }
        if (iVar24 < iVar31) {
          __dest_00 = (float *)MemAlloc((long)iVar31 << 2);
          __src = (pIVar11->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            local_e8 = __dest_00;
            memcpy(__dest_00,__src,(long)(pIVar11->TablesLastTimeActive).Size << 2);
            MemFree((pIVar11->TablesLastTimeActive).Data);
            __dest_00 = local_e8;
          }
          (pIVar11->TablesLastTimeActive).Data = __dest_00;
          (pIVar11->TablesLastTimeActive).Capacity = iVar31;
        }
      }
      iVar24 = (pIVar11->TablesLastTimeActive).Size;
      lVar29 = (long)iVar24;
      if (iVar24 <= (int)uVar13) {
        do {
          (pIVar11->TablesLastTimeActive).Data[lVar29] = -1.0;
          lVar29 = lVar29 + 1;
        } while (iVar25 != lVar29);
      }
      (pIVar11->TablesLastTimeActive).Size = iVar25;
    }
    if ((-1 < (int)uVar13) && ((int)uVar13 < (pIVar11->TablesLastTimeActive).Size)) {
      dVar4 = pIVar11->Time;
      (pIVar11->TablesLastTimeActive).Data[uVar13] = (float)dVar4;
      pIVar6[lVar23 + -1].LastTimeActive = (float)dVar4;
      p_00->MemoryCompacted = false;
      pIVar19 = (p_00->Columns).Data;
      iVar24 = (int)((long)(p_00->Columns).DataEnd - (long)pIVar19 >> 3) * -0x3b13b13b;
      if (iVar24 == columns_count || iVar24 == 0) {
        local_108 = (void *)0x0;
        pIVar19 = (ImGuiTableColumn *)0x0;
      }
      else {
        local_108 = p_00->RawData;
        p_00->RawData = (void *)0x0;
      }
      if (p_00->RawData == (void *)0x0) {
        TableBeginInitMemory(p_00,columns_count);
        p_00->IsSettingsRequestLoad = true;
        p_00->IsInitializing = true;
      }
      if (p_00->IsResetAllRequest == true) {
        p_00->IsInitializing = true;
        p_00->IsResetAllRequest = false;
        p_00->IsSettingsRequestLoad = false;
        p_00->IsSettingsDirty = true;
        p_00->SettingsLoadedFlags = 0;
      }
      if (p_00->IsInitializing == true) {
        p_00->SettingsOffset = -1;
        p_00->IsSortSpecsDirty = true;
        p_00->InstanceInteracted = -1;
        p_00->ContextPopupColumn = -1;
        p_00->ReorderColumn = -1;
        p_00->HoveredColumnBody = -1;
        p_00->HoveredColumnBorder = -1;
        p_00->AutoFitSingleColumn = -1;
        p_00->ResizedColumn = -1;
        p_00->LastResizedColumn = -1;
        if (0 < columns_count) {
          lVar23 = 0x61;
          uVar32 = 0;
          do {
            pIVar8 = (p_00->Columns).Data;
            pIVar17 = (ImGuiTableColumn *)((long)pIVar8 + lVar23 + -0x61);
            if ((p_00->Columns).DataEnd <= pIVar17) goto LAB_00164d3a;
            if ((pIVar19 == (ImGuiTableColumn *)0x0) || ((long)iVar24 <= (long)uVar32)) {
              uVar3 = *(undefined4 *)((long)pIVar8 + lVar23 + -0x4d);
              local_78 = 0;
              local_98._Channels.Data = (ImDrawChannel *)0x0;
              uStack_80 = 0;
              uStack_7d = 0;
              local_98._Current = 0;
              local_98._Count = 0;
              local_98._Channels.Size = 0;
              local_98._Channels.Capacity = 0;
              local_a8.x = 0.0;
              local_a8.y = 0.0;
              uStack_a0 = 0;
              uStack_70 = 0xffffff;
              uStack_74 = 0xffffffff;
              pIVar17->Flags = 0;
              pIVar17->WidthGiven = 0.0;
              *(undefined8 *)((long)pIVar8 + lVar23 + -0x59) = 0;
              *(undefined8 *)((long)pIVar8 + lVar23 + -0x51) = 0xbf800000;
              *(undefined4 *)((long)pIVar8 + lVar23 + -0x49) = 0xbf800000;
              puVar2 = (undefined8 *)((long)pIVar8 + lVar23 + -0x45);
              *puVar2 = 0;
              puVar2[1] = 0;
              puVar2 = (undefined8 *)((long)pIVar8 + lVar23 + -0x35);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined1 (*) [16])((long)pIVar8 + lVar23 + -0x25) = ZEXT816(0) << 0x40;
              puVar2 = (undefined8 *)((long)pIVar8 + lVar23 + -0x1a);
              *puVar2 = 0;
              puVar2[1] = 0xffffffffffffff00;
              *(undefined2 *)((long)pIVar8 + lVar23 + -10) = 0xffff;
              *(undefined1 *)((long)pIVar8 + lVar23 + -8) = 0xff;
              *(undefined8 *)((long)pIVar8 + lVar23 + -7) = 0;
              *(undefined8 *)((long)pIVar8 + lVar23 + -2) = 0;
              *(undefined4 *)((long)pIVar8 + lVar23 + -0x4d) = uVar3;
              *(undefined1 *)((long)&pIVar8->Flags + lVar23) = 1;
              *(undefined1 *)((long)pIVar8 + lVar23 + -5) = 1;
              *(undefined2 *)((long)pIVar8 + lVar23 + -7) = 0x101;
            }
            else {
              pIVar27 = (ImGuiTableColumnFlags *)((long)pIVar19 + lVar23 + -0x61);
              for (lVar29 = 0x19; lVar29 != 0; lVar29 = lVar29 + -1) {
                pIVar17->Flags = *pIVar27;
                pIVar27 = pIVar27 + (ulong)bVar33 * -2 + 1;
                pIVar17 = (ImGuiTableColumn *)((long)pIVar17 + (ulong)bVar33 * -8 + 4);
              }
              *(undefined1 *)((long)&pIVar8->WidthGiven + lVar23 + 1) =
                   *(undefined1 *)((long)&pIVar19->WidthGiven + lVar23 + 1);
              *(undefined2 *)((long)&pIVar8->Flags + lVar23 + 3) =
                   *(undefined2 *)((long)&pIVar19->Flags + lVar23 + 3);
            }
            pcVar18 = (p_00->DisplayOrderToIndex).Data + uVar32;
            if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar18) {
              pcVar18 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
              goto LAB_00164d66;
            }
            *pcVar18 = (char)uVar32;
            *(char *)((long)pIVar8 + lVar23 + -0xf) = (char)uVar32;
            uVar32 = uVar32 + 1;
            lVar23 = lVar23 + 0x68;
          } while ((uint)columns_count != uVar32);
        }
      }
      if (local_108 != (void *)0x0) {
        MemFree(local_108);
      }
      pIVar5 = local_d8;
      if (p_00->IsSettingsRequestLoad == true) {
        TableLoadSettings(p_00);
      }
      fVar37 = pIVar11->FontSize;
      fVar39 = p_00->RefScale;
      if ((fVar39 != 0.0) || (NAN(fVar39))) {
        if (((fVar39 != fVar37) || (NAN(fVar39) || NAN(fVar37))) && (0 < columns_count)) {
          pIVar19 = (p_00->Columns).Data;
          do {
            if ((p_00->Columns).DataEnd <= pIVar19) {
LAB_00164d3a:
              pcVar18 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_00164d66:
              __assert_fail("p >= Data && p < DataEnd",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_internal.h"
                            ,0x24a,pcVar18);
            }
            pIVar19->WidthRequest = pIVar19->WidthRequest * (fVar37 / fVar39);
            pIVar19 = pIVar19 + 1;
            uVar22 = uVar22 - 1;
          } while (uVar22 != 0);
        }
      }
      p_00->RefScale = fVar37;
      pIVar5->SkipItems = true;
      if (0 < (p_00->ColumnsNames).Buf.Size) {
        iVar24 = (p_00->ColumnsNames).Buf.Capacity;
        if (iVar24 < 0) {
          uVar13 = iVar24 / 2 + iVar24;
          size = 0;
          if (0 < (int)uVar13) {
            size = (size_t)uVar13;
          }
          __dest_01 = (char *)MemAlloc(size);
          pcVar18 = (p_00->ColumnsNames).Buf.Data;
          if (pcVar18 != (char *)0x0) {
            memcpy(__dest_01,pcVar18,(long)(p_00->ColumnsNames).Buf.Size);
            MemFree((p_00->ColumnsNames).Buf.Data);
          }
          (p_00->ColumnsNames).Buf.Data = __dest_01;
          (p_00->ColumnsNames).Buf.Capacity = (int)size;
        }
        (p_00->ColumnsNames).Buf.Size = 0;
      }
      TableBeginApplyRequests(p_00);
      return true;
    }
    pcVar18 = "T &ImVector<float>::operator[](int) [T = float]";
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,pcVar18);
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}